

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void __thiscall
fmt::v11::detail::file_print_buffer<_IO_FILE,_void>::~file_print_buffer
          (file_print_buffer<_IO_FILE,_void> *this)

{
  bool bVar1;
  size_t size;
  FILE *pFVar2;
  _IO_FILE *f;
  bool flush;
  file_print_buffer<_IO_FILE,_void> *this_local;
  
  size = buffer<char>::size(&this->super_buffer<char>);
  glibc_file<_IO_FILE>::advance_write_buffer(&this->file_,size);
  bVar1 = glibc_file<_IO_FILE>::needs_flush(&this->file_);
  pFVar2 = (FILE *)file_base::operator_cast_to__IO_FILE_((file_base *)&this->file_);
  funlockfile(pFVar2);
  if (bVar1) {
    pFVar2 = (FILE *)file_base::operator_cast_to__IO_FILE_((file_base *)&this->file_);
    fflush(pFVar2);
  }
  return;
}

Assistant:

~file_print_buffer() {
    file_.advance_write_buffer(size());
    bool flush = file_.needs_flush();
    F* f = file_;    // Make funlockfile depend on the template parameter F
    funlockfile(f);  // for the system API detection to work.
    if (flush) fflush(file_);
  }